

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

int __thiscall deqp::egl::MakeCurrentPerfTests::init(MakeCurrentPerfTests *this,EVP_PKEY_CTX *ctx)

{
  SurfaceType SVar1;
  int iVar2;
  EglTestContext *pEVar3;
  _Alloc_hider _Var4;
  TestNode *pTVar5;
  bool bVar6;
  bool bVar7;
  int extraout_EAX;
  MakeCurrentPerfCase *pMVar8;
  TestCaseGroup *pTVar9;
  long lVar10;
  char *pcVar11;
  undefined8 uVar12;
  bool bVar13;
  Spec spec;
  string local_b0;
  TestCaseGroup *local_90;
  TestNode *local_88;
  TestCaseGroup *local_80;
  string local_78;
  Spec local_58;
  ulong local_40;
  uint local_38;
  uint local_34;
  
  local_90 = (TestCaseGroup *)operator_new(0x78);
  local_88 = (TestNode *)this;
  TestCaseGroup::TestCaseGroup
            (local_90,(this->super_TestCaseGroup).m_eglTestCtx,"simple",
             "Simple eglMakeCurrent performance tests using single context and surface");
  lVar10 = 0;
  do {
    SVar1 = (&DAT_0034bd30)[lVar10];
    bVar6 = true;
    bVar7 = false;
    do {
      local_58.release = bVar7;
      bVar13 = bVar6;
      local_58.contextCount = 1;
      local_58.surfaceCount = 1;
      local_58.iterationCount = 100;
      local_58.sampleCount = 100;
      local_58.surfaceTypes = SVar1;
      pMVar8 = (MakeCurrentPerfCase *)operator_new(0x128);
      pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
      MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_b0,&local_58);
      _Var4._M_p = local_b0._M_dataplus._M_p;
      MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&local_58);
      MakeCurrentPerfCase::MakeCurrentPerfCase
                (pMVar8,pEVar3,&local_58,_Var4._M_p,local_78._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)local_90,(TestNode *)pMVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pTVar5 = local_88;
      bVar6 = false;
      bVar7 = true;
    } while (bVar13);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  tcu::TestNode::addChild(local_88,(TestNode *)local_90);
  pTVar9 = (TestCaseGroup *)operator_new(0x78);
  pcVar11 = "eglMakeCurrent performance tests using multiple contexts and single surface";
  TestCaseGroup::TestCaseGroup
            (pTVar9,(EglTestContext *)pTVar5[1]._vptr_TestNode,"multi_context",
             "eglMakeCurrent performance tests using multiple contexts and single surface");
  uVar12 = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
  lVar10 = 0;
  do {
    local_40 = CONCAT44(local_40._4_4_,(int)uVar12);
    local_90 = (TestCaseGroup *)CONCAT44(local_90._4_4_,(&DAT_0034b958)[lVar10]);
    lVar10 = 0;
    do {
      SVar1 = (&DAT_0034bd30)[lVar10];
      bVar6 = true;
      local_80 = (TestCaseGroup *)lVar10;
      bVar7 = false;
      do {
        local_58.release = bVar7;
        bVar13 = bVar6;
        local_58.surfaceCount = 1;
        local_58.contextCount = (int)local_90;
        local_58.iterationCount = 100;
        local_58.sampleCount = 100;
        local_58.surfaceTypes = SVar1;
        pMVar8 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_b0,&local_58);
        _Var4._M_p = local_b0._M_dataplus._M_p;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&local_58);
        MakeCurrentPerfCase::MakeCurrentPerfCase
                  (pMVar8,pEVar3,&local_58,_Var4._M_p,local_78._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)pTVar9,(TestNode *)pMVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        pTVar5 = local_88;
        bVar6 = false;
        bVar7 = true;
      } while (bVar13);
      lVar10 = (long)local_80 + 1;
    } while (lVar10 != 3);
    lVar10 = 1;
    uVar12 = 0;
  } while ((local_40 & 1) != 0);
  tcu::TestNode::addChild(local_88,(TestNode *)pTVar9);
  pTVar9 = (TestCaseGroup *)operator_new(0x78);
  pcVar11 = "eglMakeCurrent performance tests using single context and multiple surfaces";
  TestCaseGroup::TestCaseGroup
            (pTVar9,(EglTestContext *)pTVar5[1]._vptr_TestNode,"multi_surface",
             "eglMakeCurrent performance tests using single context and multiple surfaces");
  uVar12 = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
  lVar10 = 0;
  do {
    local_40 = CONCAT44(local_40._4_4_,(int)uVar12);
    local_90 = (TestCaseGroup *)CONCAT44(local_90._4_4_,(&DAT_0034b958)[lVar10]);
    lVar10 = 0;
    do {
      SVar1 = (&DAT_0034bd40)[lVar10];
      bVar6 = true;
      local_80 = (TestCaseGroup *)lVar10;
      bVar7 = false;
      do {
        local_58.release = bVar7;
        bVar13 = bVar6;
        local_58.surfaceCount = (int)local_90;
        local_58.contextCount = 1;
        local_58.iterationCount = 100;
        local_58.sampleCount = 100;
        local_58.surfaceTypes = SVar1;
        pMVar8 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_b0,&local_58);
        _Var4._M_p = local_b0._M_dataplus._M_p;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&local_58);
        MakeCurrentPerfCase::MakeCurrentPerfCase
                  (pMVar8,pEVar3,&local_58,_Var4._M_p,local_78._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)pTVar9,(TestNode *)pMVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        pTVar5 = local_88;
        bVar6 = false;
        bVar7 = true;
      } while (bVar13);
      lVar10 = (long)local_80 + 1;
    } while (lVar10 != 7);
    lVar10 = 1;
    uVar12 = 0;
  } while ((local_40 & 1) != 0);
  tcu::TestNode::addChild(local_88,(TestNode *)pTVar9);
  local_80 = (TestCaseGroup *)operator_new(0x78);
  pcVar11 = "eglMakeCurrent performance tests using multiple contexts and multiple surfaces";
  TestCaseGroup::TestCaseGroup
            (local_80,(EglTestContext *)pTVar5[1]._vptr_TestNode,"complex",
             "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");
  pcVar11 = (char *)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
  lVar10 = 0;
  do {
    local_38 = (uint)pcVar11;
    iVar2 = (&DAT_0034b958)[lVar10];
    pcVar11 = "Surface returned EGL_BAD_ALLOC";
    lVar10 = 0;
    do {
      local_34 = (uint)pcVar11;
      local_90 = (TestCaseGroup *)CONCAT44(local_90._4_4_,(&DAT_0034b958)[lVar10]);
      lVar10 = 0;
      do {
        SVar1 = (&DAT_0034bd40)[lVar10];
        bVar6 = true;
        local_40 = lVar10;
        bVar7 = false;
        do {
          local_58.release = bVar7;
          bVar13 = bVar6;
          local_58.surfaceCount = iVar2;
          local_58.contextCount = (int)local_90;
          local_58.iterationCount = 100;
          local_58.sampleCount = 100;
          local_58.surfaceTypes = SVar1;
          pMVar8 = (MakeCurrentPerfCase *)operator_new(0x128);
          pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
          MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_b0,&local_58);
          _Var4._M_p = local_b0._M_dataplus._M_p;
          MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&local_58);
          MakeCurrentPerfCase::MakeCurrentPerfCase
                    (pMVar8,pEVar3,&local_58,_Var4._M_p,local_78._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)local_80,(TestNode *)pMVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          bVar6 = false;
          bVar7 = true;
        } while (bVar13);
        lVar10 = local_40 + 1;
      } while (lVar10 != 7);
      lVar10 = 1;
      pcVar11 = (char *)0x0;
    } while ((local_34 & 1) != 0);
  } while ((local_38 & 1) != 0);
  tcu::TestNode::addChild(local_88,(TestNode *)local_80);
  return extraout_EAX;
}

Assistant:

void MakeCurrentPerfTests::init (void)
{
	const int iterationCount	= 100;
	const int sampleCount		= 100;

	// Add simple test group
	{
		TestCaseGroup* simple = new TestCaseGroup(m_eglTestCtx, "simple", "Simple eglMakeCurrent performance tests using single context and surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
			{
				MakeCurrentPerfCase::Spec spec;

				spec.surfaceTypes	= types[typeNdx];
				spec.contextCount	= 1;
				spec.surfaceCount	= 1;
				spec.release		= (releaseNdx == 1);
				spec.iterationCount	= iterationCount;
				spec.sampleCount	= sampleCount;

				simple->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
			}
		}

		addChild(simple);
	}

	// Add multi context test group
	{
		TestCaseGroup* multiContext = new TestCaseGroup(m_eglTestCtx, "multi_context", "eglMakeCurrent performance tests using multiple contexts and single surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		const int contextCounts[] = {
			10, 100
		};

		for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.contextCount	= contextCounts[contextCountNdx];
					spec.surfaceCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiContext->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiContext);
	}

	// Add multi surface test group
	{
		TestCaseGroup* multiSurface = new TestCaseGroup(m_eglTestCtx, "multi_surface", "eglMakeCurrent performance tests using single context and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
					spec.contextCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiSurface->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiSurface);
	}

	// Add Complex? test group
	{
		TestCaseGroup* multi = new TestCaseGroup(m_eglTestCtx, "complex", "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};


		const int contextCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
			{
				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
				{
					for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
					{
						MakeCurrentPerfCase::Spec spec;

						spec.surfaceTypes	= types[typeNdx];
						spec.contextCount	= contextCounts[contextCountNdx];
						spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
						spec.release		= (releaseNdx == 1);
						spec.iterationCount	= iterationCount;
						spec.sampleCount	= sampleCount;

						multi->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
					}
				}
			}
		}

		addChild(multi);
	}
}